

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

int array_container_intersection_cardinality(array_container_t *array1,array_container_t *array2)

{
  int iVar1;
  undefined1 (*A) [16];
  undefined1 (*B) [16];
  long lVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  int32_t iVar5;
  ulong uVar6;
  ulong lenB;
  int iVar7;
  ulong lenA;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  undefined4 in_XMM0_Da;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  
  iVar7 = array1->cardinality;
  lenA = (ulong)iVar7;
  iVar1 = array2->cardinality;
  lenB = (ulong)iVar1;
  if (iVar7 * 0x40 < iVar1) {
    iVar5 = intersect_skewed_uint16_cardinality(array1->array,lenA,array2->array,lenB);
    return iVar5;
  }
  if (iVar1 * 0x40 < iVar7) {
    iVar5 = intersect_skewed_uint16_cardinality(array2->array,lenB,array1->array,lenA);
    return iVar5;
  }
  lVar2 = cpuid_Extended_Feature_Enumeration_info(7);
  A = (undefined1 (*) [16])array1->array;
  B = (undefined1 (*) [16])array2->array;
  if ((*(uint *)(lVar2 + 4) & 0x20) == 0) {
    iVar5 = intersect_uint16_cardinality((uint16_t *)A,lenA,(uint16_t *)B,lenB);
    return iVar5;
  }
  uVar6 = lenA & 0xfffffffffffffff8;
  uVar12 = lenB & 0xfffffffffffffff8;
  if (uVar12 == 0 || uVar6 == 0) {
    uVar9 = 0;
    uVar11 = 0;
    iVar7 = 0;
  }
  else {
    auVar3 = vlddqu_avx(*A);
    auVar13 = ZEXT1664(auVar3);
    auVar3 = vlddqu_avx(*B);
    auVar14 = ZEXT1664(auVar3);
    iVar7 = 0;
    uVar8 = 0;
    uVar10 = 0;
    do {
      uVar9 = uVar8;
      uVar11 = uVar10;
      if ((*(short *)(*A + uVar10 * 2) != 0) && (*(short *)(*B + uVar8 * 2) != 0)) break;
      vpcmpestrm_avx(auVar14._0_16_,auVar13._0_16_,1);
      if (*(ushort *)(*B + uVar8 * 2 + 0xe) < *(ushort *)(*A + uVar10 * 2 + 0xe)) {
LAB_00101911:
        bVar4 = true;
        if (*(ushort *)(*B + uVar8 * 2 + 0xe) <= *(ushort *)(*A + uVar10 * 2 + 0xe)) {
          uVar9 = uVar8 + 8;
          if (uVar9 == uVar12) goto LAB_00101921;
          auVar3 = vlddqu_avx(*(undefined1 (*) [16])(B[1] + uVar8 * 2));
          auVar14 = ZEXT1664(auVar3);
        }
      }
      else {
        uVar11 = uVar10 + 8;
        if (uVar11 != uVar6) {
          auVar3 = vlddqu_avx(*(undefined1 (*) [16])(A[1] + uVar10 * 2));
          auVar13 = ZEXT1664(auVar3);
          goto LAB_00101911;
        }
LAB_00101921:
        bVar4 = false;
      }
      iVar7 = iVar7 + POPCOUNT(in_XMM0_Da);
      uVar8 = uVar9;
      uVar10 = uVar11;
    } while (bVar4);
    uVar8 = uVar9;
    uVar10 = uVar11;
    if (uVar9 < uVar12 && uVar11 < uVar6) {
      do {
        vpcmpistrm_avx(auVar14._0_16_,auVar13._0_16_,1);
        uVar11 = uVar10;
        uVar9 = uVar8;
        if (*(ushort *)(*B + uVar8 * 2 + 0xe) < *(ushort *)(*A + uVar10 * 2 + 0xe)) {
LAB_00101973:
          bVar4 = true;
          if (*(ushort *)(*B + uVar8 * 2 + 0xe) <= *(ushort *)(*A + uVar10 * 2 + 0xe)) {
            uVar9 = uVar8 + 8;
            if (uVar9 == uVar12) goto LAB_00101983;
            auVar3 = vlddqu_avx(*(undefined1 (*) [16])(B[1] + uVar8 * 2));
            auVar14 = ZEXT1664(auVar3);
          }
        }
        else {
          uVar11 = uVar10 + 8;
          if (uVar11 != uVar6) {
            auVar3 = vlddqu_avx(*(undefined1 (*) [16])(A[1] + uVar10 * 2));
            auVar13 = ZEXT1664(auVar3);
            goto LAB_00101973;
          }
LAB_00101983:
          bVar4 = false;
        }
        iVar7 = iVar7 + POPCOUNT(in_XMM0_Da);
        uVar8 = uVar9;
        uVar10 = uVar11;
      } while (bVar4);
    }
  }
  if (uVar9 < lenB && uVar11 < lenA) {
    do {
      if (*(ushort *)(*A + uVar11 * 2) < *(ushort *)(*B + uVar9 * 2)) {
        uVar11 = uVar11 + 1;
      }
      else {
        if (*(ushort *)(*A + uVar11 * 2) <= *(ushort *)(*B + uVar9 * 2)) {
          iVar7 = iVar7 + 1;
          uVar11 = uVar11 + 1;
        }
        uVar9 = uVar9 + 1;
      }
    } while ((uVar11 < lenA) && (uVar9 < lenB));
  }
  return iVar7;
}

Assistant:

int array_container_intersection_cardinality(const array_container_t *array1,
                                             const array_container_t *array2) {
    int32_t card_1 = array1->cardinality, card_2 = array2->cardinality;
    const int threshold = 64;  // subject to tuning
    if (card_1 * threshold < card_2) {
        return intersect_skewed_uint16_cardinality(array1->array, card_1,
                                                   array2->array, card_2);
    } else if (card_2 * threshold < card_1) {
        return intersect_skewed_uint16_cardinality(array2->array, card_2,
                                                   array1->array, card_1);
    } else {
#ifdef CROARING_IS_X64
    if( croaring_avx2() ) {
        return intersect_vector16_cardinality(array1->array, card_1,
                                              array2->array, card_2);
    } else {
        return intersect_uint16_cardinality(array1->array, card_1,
                                            array2->array, card_2);
    }
#else
        return intersect_uint16_cardinality(array1->array, card_1,
                                            array2->array, card_2);
#endif
    }
}